

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cpp
# Opt level: O0

void __thiscall jsonnet::internal::CompilerPass::fields(CompilerPass *this,ObjectFields *fields)

{
  bool bVar1;
  reference pOVar2;
  long *in_RDI;
  ObjectField *field;
  iterator __end2;
  iterator __begin2;
  ObjectFields *__range2;
  vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
  *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  Kind in_stack_ffffffffffffffc4;
  __normal_iterator<jsonnet::internal::ObjectField_*,_std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>_>
  local_20 [4];
  
  local_20[0]._M_current =
       (ObjectField *)
       std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
       ::begin(in_stack_ffffffffffffffb8);
  std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>::end
            (in_stack_ffffffffffffffb8);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<jsonnet::internal::ObjectField_*,_std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>_>
                             *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                            (__normal_iterator<jsonnet::internal::ObjectField_*,_std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>_>
                             *)in_stack_ffffffffffffffb8), bVar1) {
    pOVar2 = __gnu_cxx::
             __normal_iterator<jsonnet::internal::ObjectField_*,_std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>_>
             ::operator*(local_20);
    in_stack_ffffffffffffffc4 = pOVar2->kind;
    if (in_stack_ffffffffffffffc4 == ASSERT) {
      (**(code **)(*in_RDI + 8))(in_RDI,&pOVar2->fodder1);
      (**(code **)(*in_RDI + 0x30))(in_RDI,&pOVar2->expr2);
      if (pOVar2->expr3 != (AST *)0x0) {
        (**(code **)(*in_RDI + 8))(in_RDI,&pOVar2->opFodder);
        (**(code **)(*in_RDI + 0x30))(in_RDI,&pOVar2->expr3);
      }
    }
    else if (in_stack_ffffffffffffffc4 - FIELD_ID < 3) {
      if (pOVar2->kind == FIELD_ID) {
        (**(code **)(*in_RDI + 8))(in_RDI,&pOVar2->fodder1);
      }
      else if (pOVar2->kind == FIELD_STR) {
        (**(code **)(*in_RDI + 0x30))(in_RDI,&pOVar2->expr1);
      }
      else if (pOVar2->kind == FIELD_EXPR) {
        (**(code **)(*in_RDI + 8))(in_RDI,&pOVar2->fodder1);
        (**(code **)(*in_RDI + 0x30))(in_RDI,&pOVar2->expr1);
        (**(code **)(*in_RDI + 8))(in_RDI,&pOVar2->fodder2);
      }
      (**(code **)(*in_RDI + 0x20))(in_RDI,pOVar2);
      (**(code **)(*in_RDI + 8))(in_RDI,&pOVar2->opFodder);
      (**(code **)(*in_RDI + 0x30))(in_RDI,&pOVar2->expr2);
    }
    else if (in_stack_ffffffffffffffc4 == LOCAL) {
      (**(code **)(*in_RDI + 8))(in_RDI,&pOVar2->fodder1);
      (**(code **)(*in_RDI + 8))(in_RDI,&pOVar2->fodder2);
      (**(code **)(*in_RDI + 0x20))(in_RDI,pOVar2);
      (**(code **)(*in_RDI + 8))(in_RDI,&pOVar2->opFodder);
      (**(code **)(*in_RDI + 0x30))(in_RDI,&pOVar2->expr2);
    }
    (**(code **)(*in_RDI + 8))(in_RDI,&pOVar2->commaFodder);
    __gnu_cxx::
    __normal_iterator<jsonnet::internal::ObjectField_*,_std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>_>
    ::operator++(local_20);
  }
  return;
}

Assistant:

void CompilerPass::fields(ObjectFields &fields)
{
    for (auto &field : fields) {
        switch (field.kind) {
            case ObjectField::LOCAL: {
                fodder(field.fodder1);
                fodder(field.fodder2);
                fieldParams(field);
                fodder(field.opFodder);
                expr(field.expr2);
            } break;

            case ObjectField::FIELD_ID:
            case ObjectField::FIELD_STR:
            case ObjectField::FIELD_EXPR: {
                if (field.kind == ObjectField::FIELD_ID) {
                    fodder(field.fodder1);

                } else if (field.kind == ObjectField::FIELD_STR) {
                    expr(field.expr1);

                } else if (field.kind == ObjectField::FIELD_EXPR) {
                    fodder(field.fodder1);
                    expr(field.expr1);
                    fodder(field.fodder2);
                }
                fieldParams(field);
                fodder(field.opFodder);
                expr(field.expr2);

            } break;

            case ObjectField::ASSERT: {
                fodder(field.fodder1);
                expr(field.expr2);
                if (field.expr3 != nullptr) {
                    fodder(field.opFodder);
                    expr(field.expr3);
                }
            } break;
        }

        fodder(field.commaFodder);
    }
}